

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# First.hpp
# Opt level: O0

OUT * __thiscall
linq::
First<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,bool,int>>
          (OUT *__return_storage_ptr__,linq *this,
          GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
          *source)

{
  ulong uVar1;
  out_of_range *this_00;
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  *source_local;
  
  (*(code *)**(undefined8 **)this)();
  uVar1 = (**(code **)(*(long *)this + 8))();
  if ((uVar1 & 1) == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"this");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  (**(code **)(*(long *)this + 0x18))(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

auto First(S&& source)
	{
		source.Init();

		if(!source.Valid())
			throw std::out_of_range("this");

		return source.Current();
	}